

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O0

Grammar * __thiscall
xercesc_4_0::IGXMLScanner::loadGrammar
          (IGXMLScanner *this,InputSource *src,short grammarType,bool toCache)

{
  undefined8 uVar1;
  Codes anon_var_0;
  Codes anon_var_0_1;
  OutOfMemoryException *anon_var_0_3;
  XMLException *excToCatch;
  OutOfMemoryException *anon_var_0_2;
  undefined1 local_40 [8];
  ReaderMgrResetType resetReaderMgr;
  Grammar *loadedGrammar;
  bool toCache_local;
  short grammarType_local;
  InputSource *src_local;
  IGXMLScanner *this_local;
  
  resetReaderMgr._16_8_ = 0;
  JanitorMemFunCall<xercesc_4_0::ReaderMgr>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::ReaderMgr> *)local_40,
             &(this->super_XMLScanner).fReaderMgr,(MFPT)ReaderMgr::reset);
  GrammarResolver::cacheGrammarFromParse((this->super_XMLScanner).fGrammarResolver,false);
  GrammarResolver::useCachedGrammarInParse((this->super_XMLScanner).fGrammarResolver,toCache);
  (this->super_XMLScanner).fRootGrammar = (Grammar *)0x0;
  if ((this->super_XMLScanner).fValScheme == Val_Auto) {
    (this->super_XMLScanner).fValidate = true;
  }
  (this->super_XMLScanner).fInException = false;
  (this->super_XMLScanner).fStandalone = false;
  (this->super_XMLScanner).fErrorCount = 0;
  (this->super_XMLScanner).fHasNoDTD = true;
  this->fSeeXsi = false;
  if (grammarType == 1) {
    resetReaderMgr._16_8_ = loadXMLSchemaGrammar(this,src,toCache);
  }
  else if (grammarType == 0) {
    resetReaderMgr._16_8_ = loadDTDGrammar(this,src,toCache);
  }
  uVar1 = resetReaderMgr._16_8_;
  JanitorMemFunCall<xercesc_4_0::ReaderMgr>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::ReaderMgr> *)local_40);
  return (Grammar *)uVar1;
}

Assistant:

Grammar* IGXMLScanner::loadGrammar(const   InputSource& src
                                   , const short        grammarType
                                   , const bool         toCache)
{
    Grammar* loadedGrammar = 0;

    ReaderMgrResetType  resetReaderMgr(&fReaderMgr, &ReaderMgr::reset);

    try
    {
        fGrammarResolver->cacheGrammarFromParse(false);
		// if the new grammar has to be cached, better use the already cached
		// grammars, or the an exception will be thrown when caching an already
		// cached grammar
        fGrammarResolver->useCachedGrammarInParse(toCache);
        fRootGrammar = 0;

        if (fValScheme == Val_Auto) {
            fValidate = true;
        }

        // Reset some status flags
        fInException = false;
        fStandalone = false;
        fErrorCount = 0;
        fHasNoDTD = true;
        fSeeXsi = false;

        if (grammarType == Grammar::SchemaGrammarType) {
            loadedGrammar = loadXMLSchemaGrammar(src, toCache);
        }
        else if (grammarType == Grammar::DTDGrammarType) {
            loadedGrammar = loadDTDGrammar(src, toCache);
        }
    }
    //  NOTE:
    //
    //  In all of the error processing below, the emitError() call MUST come
    //  before the flush of the reader mgr, or it will fail because it tries
    //  to find out the position in the XML source of the error.
    catch(const XMLErrs::Codes)
    {
        // This is a 'first fatal error' type exit, so fall through
    }
    catch(const XMLValid::Codes)
    {
        // This is a 'first fatal error' type exit, so fall through
    }
    catch(const XMLException& excToCatch)
    {
        //  Emit the error and catch any user exception thrown from here. Make
        //  sure in all cases we flush the reader manager.
        fInException = true;
        try
        {
            if (excToCatch.getErrorType() == XMLErrorReporter::ErrType_Warning)
                emitError
                (
                    XMLErrs::XMLException_Warning
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
            else if (excToCatch.getErrorType() >= XMLErrorReporter::ErrType_Fatal)
                emitError
                (
                    XMLErrs::XMLException_Fatal
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
            else
                emitError
                (
                    XMLErrs::XMLException_Error
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
        }
        catch(const OutOfMemoryException&)
        {
            // This is a special case for out-of-memory
            // conditions, because resetting the ReaderMgr
            // can be problematic.
            resetReaderMgr.release();

            throw;
        }
    }
    catch(const OutOfMemoryException&)
    {
        // This is a special case for out-of-memory
        // conditions, because resetting the ReaderMgr
        // can be problematic.
        resetReaderMgr.release();

        throw;
    }

    return loadedGrammar;
}